

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::MappingNode::increment(MappingNode *this)

{
  bool bVar1;
  Token *pTVar2;
  BumpPtrAllocator *Alloc;
  KeyValueNode *this_00;
  KeyValueNode *local_160;
  Twine local_150;
  Token local_138;
  undefined4 local_fc;
  Token local_f8;
  Twine local_c0;
  Token local_a8;
  undefined1 local_59;
  BumpPtrAllocator *local_58;
  KeyValueNode *local_50;
  undefined1 local_48 [8];
  Token T;
  MappingNode *this_local;
  
  T.Value.field_2._8_8_ = this;
  bVar1 = Node::failed(&this->super_Node);
  if (bVar1) {
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
    return;
  }
  if ((this->CurrentEntry != (KeyValueNode *)0x0) &&
     (KeyValueNode::skip(this->CurrentEntry), this->Type == MT_Inline)) {
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
    return;
  }
  pTVar2 = Node::peekNext(&this->super_Node);
  Token::Token((Token *)local_48,pTVar2);
  if ((local_48._0_4_ == TK_Key) || (local_48._0_4_ == TK_Scalar)) {
    Alloc = Node::getAllocator(&this->super_Node);
    this_00 = (KeyValueNode *)Node::operator_new(0x58,Alloc,0x10);
    local_59 = 0;
    local_160 = (KeyValueNode *)0x0;
    if (this_00 != (KeyValueNode *)0x0) {
      local_59 = 1;
      local_58 = Alloc;
      local_50 = this_00;
      KeyValueNode::KeyValueNode(this_00,(this->super_Node).Doc);
      local_160 = this_00;
    }
    this->CurrentEntry = local_160;
  }
  else if (this->Type == MT_Block) {
    if (local_48._0_4_ != TK_Error) {
      if (local_48._0_4_ == TK_BlockEnd) {
        Node::getNext(&local_a8,&this->super_Node);
        Token::~Token(&local_a8);
        this->IsAtEnd = true;
        this->CurrentEntry = (KeyValueNode *)0x0;
        goto LAB_028a9a0c;
      }
      Twine::Twine(&local_c0,"Unexpected token. Expected Key or Block End");
      Node::setError(&this->super_Node,&local_c0,(Token *)local_48);
    }
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
  }
  else {
    if (local_48._0_4_ != TK_Error) {
      if (local_48._0_4_ == TK_FlowEntry) {
        Node::getNext(&local_f8,&this->super_Node);
        Token::~Token(&local_f8);
        increment(this);
        local_fc = 1;
        goto LAB_028a9a16;
      }
      if (local_48._0_4_ != TK_FlowMappingEnd) {
        Twine::Twine(&local_150,"Unexpected token. Expected Key, Flow Entry, or Flow Mapping End.");
        Node::setError(&this->super_Node,&local_150,(Token *)local_48);
        this->IsAtEnd = true;
        this->CurrentEntry = (KeyValueNode *)0x0;
        goto LAB_028a9a0c;
      }
      Node::getNext(&local_138,&this->super_Node);
      Token::~Token(&local_138);
    }
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
  }
LAB_028a9a0c:
  local_fc = 0;
LAB_028a9a16:
  Token::~Token((Token *)local_48);
  return;
}

Assistant:

void MappingNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry) {
    CurrentEntry->skip();
    if (Type == MT_Inline) {
      IsAtEnd = true;
      CurrentEntry = nullptr;
      return;
    }
  }
  Token T = peekNext();
  if (T.Kind == Token::TK_Key || T.Kind == Token::TK_Scalar) {
    // KeyValueNode eats the TK_Key. That way it can detect null keys.
    CurrentEntry = new (getAllocator()) KeyValueNode(Doc);
  } else if (Type == MT_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError("Unexpected token. Expected Key or Block End", T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      return increment();
    case Token::TK_FlowMappingEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Key, Flow Entry, or Flow "
                "Mapping End."
              , T);
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  }
}